

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O3

char * blogc_content_parse(char *src,size_t *end_excerpt,char **first_header,char **description,
                          char **endl,bc_slist_t **headers)

{
  ulong uVar1;
  byte bVar2;
  _Bool _Var3;
  uint uVar4;
  size_t sVar5;
  byte *__ptr;
  bc_string_t *str;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  bc_string_t *pbVar10;
  byte *text;
  byte *slug;
  bc_slist_t *pbVar11;
  char *pcVar12;
  byte bVar13;
  byte *pbVar14;
  bc_slist_t *l;
  _bc_slist_t *p_Var15;
  undefined4 uVar16;
  bc_slist_t *l_1;
  bool bVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  bc_slist_t *l_2;
  bool bVar23;
  bc_slist_t *local_e8;
  ulong local_e0;
  char *local_d8;
  ulong local_b0;
  bc_slist_t *local_a8;
  ulong local_a0;
  ulong local_88;
  size_t local_78;
  byte *local_70;
  size_t local_60;
  
  sVar5 = strlen(src);
  if (endl == (char **)0x0) {
    __ptr = (byte *)bc_malloc(3);
  }
  else {
    __ptr = (byte *)*endl;
    bVar17 = true;
    if (__ptr != (byte *)0x0) goto LAB_00106bb0;
    __ptr = (byte *)bc_malloc(3);
    *endl = (char *)__ptr;
  }
  __ptr[0] = 10;
  __ptr[1] = 0;
  bVar17 = false;
LAB_00106bb0:
  str = bc_string_new();
  if (sVar5 != 0) {
    uVar16 = 1;
    uVar22 = 0;
    local_e0 = 0;
    local_a8 = (bc_slist_t *)0x0;
    local_e8 = (bc_slist_t *)0x0;
    bVar2 = 0;
    local_60 = 0;
    local_d8 = (char *)0x0;
    local_70 = (byte *)0x0;
    local_88 = 0;
    local_78 = 0;
    local_a0 = 0;
    local_b0 = 0;
    do {
      bVar20 = src[uVar22];
      bVar23 = uVar22 == sVar5 - 1;
      if ((bVar20 == 0xd) || (bVar20 == 10)) {
        uVar1 = uVar22 + 1;
        uVar21 = uVar22;
        if (uVar1 < sVar5) {
          if (bVar20 == 0xd) {
            bVar13 = 10;
            if (src[uVar1] == '\n') {
LAB_00106cad:
              if (!bVar17) {
                *__ptr = bVar20;
                __ptr[1] = src[uVar1];
                __ptr[2] = 0;
                bVar17 = true;
                bVar13 = src[uVar1];
              }
              bVar20 = bVar13;
              bVar23 = uVar1 == sVar5 - 1;
              uVar21 = uVar1;
              local_88 = uVar22;
            }
            else {
              bVar20 = 0xd;
            }
          }
          else if (bVar20 == 10) {
            bVar13 = 0xd;
            if (src[uVar1] == '\r') goto LAB_00106cad;
            bVar20 = 10;
          }
        }
        uVar22 = uVar21;
        if (!bVar17) {
          *__ptr = bVar20;
          __ptr[1] = 0;
          bVar17 = true;
        }
      }
      uVar1 = local_b0;
      switch(uVar16) {
      case 1:
        uVar16 = 1;
        if (((bVar20 != 10) && (uVar4 = (uint)bVar20, uVar4 != 0xd)) && (!bVar23)) {
          if ((end_excerpt == (size_t *)0x0) || (bVar20 != 0x2e)) {
            if (uVar4 - 0x2a < 2) {
LAB_00107f6c:
              uVar16 = 0xf;
              local_e0 = uVar22;
              uVar1 = uVar22;
              bVar2 = bVar20;
            }
            else if (uVar4 == 0x23) {
              uVar16 = 4;
              local_70 = (byte *)0x1;
              local_e0 = uVar22;
            }
            else {
              if (uVar4 == 0x2d) goto LAB_00107f6c;
              uVar16 = 0x14;
              local_e0 = uVar22;
              uVar1 = uVar22;
              if (9 < (byte)(bVar20 - 0x30)) {
                if (uVar4 < 0x3c) {
                  uVar16 = 0xc;
                  if ((uVar4 != 9) && (uVar4 != 0x20)) {
LAB_00107fdc:
                    uVar16 = 0x18;
                    uVar1 = local_b0;
                  }
                }
                else if (uVar4 == 0x3e) {
                  uVar16 = 9;
                }
                else {
                  if (uVar4 != 0x3c) goto LAB_00107fdc;
                  uVar16 = 7;
                  uVar1 = local_b0;
                }
              }
            }
          }
          else {
            local_78 = str->len;
            uVar16 = 2;
            local_e0 = uVar22;
          }
        }
        break;
      case 2:
        if (end_excerpt == (size_t *)0x0) {
LAB_00107015:
          uVar16 = 0x18;
LAB_0010701a:
          local_78 = 0;
        }
        else if ((bVar20 == 10) || (bVar20 == 0xd)) {
          uVar16 = 3;
        }
        else {
          uVar16 = 2;
          if (bVar20 != 0x2e) goto LAB_00107015;
        }
        break;
      case 3:
        uVar16 = 0x19;
        if ((end_excerpt == (size_t *)0x0) || ((bVar20 != 0xd && (bVar20 != 10))))
        goto LAB_0010701a;
        *end_excerpt = local_78;
        uVar16 = 1;
        break;
      case 4:
        uVar16 = 5;
        if ((bVar20 != 9) && (bVar20 != 0x20)) {
          if (bVar20 == 0x23) {
            local_70 = local_70 + 1;
            uVar16 = 4;
          }
          else {
            uVar16 = 0x18;
          }
        }
        break;
      case 5:
        if (0xc < bVar20) {
          if (bVar20 == 0x20) goto LAB_00107c51;
          local_e0 = uVar22;
          if (bVar20 != 0xd) goto LAB_0010704f;
          goto switchD_00106d05_caseD_6;
        }
        if (bVar20 == 9) {
LAB_00107c51:
          uVar16 = 5;
        }
        else {
          local_e0 = uVar22;
          if (bVar20 == 10) goto switchD_00106d05_caseD_6;
LAB_0010704f:
          uVar16 = 6;
          local_e0 = uVar22;
        }
        break;
      case 6:
switchD_00106d05_caseD_6:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (bVar23)) {
          if ((((!bVar23) || (bVar20 == 0xd)) || (local_a0 = sVar5, bVar20 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar22;
          }
          pcVar12 = bc_strndup(src + local_e0,local_a0 - local_e0);
          if ((first_header != (char **)0x0) && (*first_header == (char *)0x0)) {
            pcVar8 = blogc_htmlentities(pcVar12);
            *first_header = pcVar8;
          }
          sVar9 = strlen(pcVar12);
          text = (byte *)blogc_content_parse_inline_internal(pcVar12,sVar9);
          slug = (byte *)blogc_slugify(pcVar12);
          if (headers != (bc_slist_t **)0x0) {
            pbVar11 = blogc_toctree_append(*headers,(size_t)local_70,(char *)slug,(char *)text);
            *headers = pbVar11;
          }
          if (slug == (byte *)0x0) {
            pcVar8 = "<h%d>%s</h%d>%s";
            pbVar14 = text;
            pbVar18 = local_70;
            pbVar19 = __ptr;
          }
          else {
            pcVar8 = "<h%d id=\"%s\">%s</h%d>%s";
            pbVar14 = slug;
            pbVar18 = text;
            pbVar19 = local_70;
          }
          bc_string_append_printf(str,pcVar8,local_70,pbVar14,pbVar18,pbVar19);
          free(slug);
          free(text);
          free(pcVar12);
LAB_00107b7a:
          uVar16 = 1;
          local_e0 = uVar22;
        }
        break;
      case 7:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 7, bVar23)) {
          if (bVar23) {
            if (((bVar20 == 0xd) || (local_a0 = sVar5, bVar20 == 10)) &&
               (local_a0 = local_88, local_88 == 0)) {
              local_a0 = uVar22;
            }
            goto switchD_00106d05_caseD_8;
          }
          local_a0 = local_88;
          if (local_88 == 0) {
            local_a0 = uVar22;
          }
          uVar16 = 8;
        }
        break;
      case 8:
switchD_00106d05_caseD_8:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 7, bVar23)) {
          pcVar12 = bc_strndup(src + local_e0,local_a0 - local_e0);
          bc_string_append_printf(str,"%s%s",pcVar12,__ptr);
          free(pcVar12);
LAB_00106fbd:
          uVar16 = 1;
          local_e0 = uVar22;
        }
        break;
      case 9:
        uVar16 = 9;
        if ((bVar20 != 9) && (bVar20 != 0x20)) {
          local_d8 = bc_strndup(src + local_e0,uVar22 - local_e0);
          uVar16 = 10;
        }
        break;
      case 10:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 10, bVar23)) {
          if ((((!bVar23) || (bVar20 == 0xd)) || (local_a0 = sVar5, bVar20 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar22;
          }
          pcVar12 = bc_strndup(src + local_b0,local_a0 - local_b0);
          _Var3 = bc_str_starts_with(pcVar12,local_d8);
          if (_Var3) {
            sVar9 = strlen(local_d8);
            pcVar8 = bc_strdup(pcVar12 + sVar9);
            local_e8 = bc_slist_append(local_e8,pcVar8);
            free(pcVar12);
            uVar16 = 0xb;
            if (bVar23) goto switchD_00106d05_caseD_b;
          }
          else {
LAB_0010780e:
            free(local_d8);
            bc_slist_free_full(local_e8,free);
            free(pcVar12);
            uVar16 = 0x18;
LAB_00107848:
            local_d8 = (char *)0x0;
            local_e8 = (bc_slist_t *)0x0;
            if (bVar23) {
              local_e8 = (bc_slist_t *)0x0;
              goto LAB_00107f3d;
            }
          }
        }
        break;
      case 0xb:
switchD_00106d05_caseD_b:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 10, uVar1 = uVar22, bVar23)) {
          pbVar10 = bc_string_new();
          for (p_Var15 = local_e8; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(pbVar10,"%s%s",p_Var15->data);
          }
          pcVar12 = blogc_content_parse(pbVar10->str,(size_t *)0x0,(char **)0x0,(char **)0x0,endl,
                                        (bc_slist_t **)0x0);
          bc_string_append_printf(str,"<blockquote>%s</blockquote>%s",pcVar12,__ptr);
          free(pcVar12);
          bc_string_free(pbVar10,true);
          bc_slist_free_full(local_e8,free);
          free(local_d8);
LAB_00107f10:
          uVar16 = 1;
          local_d8 = (char *)0x0;
          local_e8 = (bc_slist_t *)0x0;
          uVar1 = uVar22;
        }
        break;
      case 0xc:
        uVar16 = 0xc;
        if ((bVar20 != 9) && (bVar20 != 0x20)) {
          local_d8 = bc_strndup(src + local_e0,uVar22 - local_e0);
          uVar16 = 0xd;
        }
        break;
      case 0xd:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0xd, bVar23)) {
          if ((((!bVar23) || (bVar20 == 0xd)) || (local_a0 = sVar5, bVar20 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar22;
          }
          pcVar12 = bc_strndup(src + local_b0,local_a0 - local_b0);
          _Var3 = bc_str_starts_with(pcVar12,local_d8);
          if (!_Var3) goto LAB_0010780e;
          sVar9 = strlen(local_d8);
          pcVar8 = bc_strdup(pcVar12 + sVar9);
          local_e8 = bc_slist_append(local_e8,pcVar8);
          free(pcVar12);
          uVar16 = 0xe;
          if (bVar23) goto switchD_00106d05_caseD_e;
        }
        break;
      case 0xe:
switchD_00106d05_caseD_e:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0xd, uVar1 = uVar22, bVar23)) {
          bc_string_append(str,"<pre><code>");
          for (p_Var15 = local_e8; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            pcVar12 = blogc_htmlentities((char *)p_Var15->data);
            if (p_Var15->next == (_bc_slist_t *)0x0) {
              bc_string_append_printf(str,"%s",pcVar12);
            }
            else {
              bc_string_append_printf(str,"%s%s",pcVar12,__ptr);
            }
            free(pcVar12);
          }
          bc_string_append_printf(str,"</code></pre>%s",__ptr);
LAB_00107efe:
          bc_slist_free_full(local_e8,free);
          free(local_d8);
          goto LAB_00107f10;
        }
        break;
      case 0xf:
        if (uVar22 == local_e0 + 1) {
          uVar16 = 0x10;
          if (bVar20 != bVar2) {
            if (bVar2 != 0x2a) goto LAB_0010786a;
            bVar2 = 0x2a;
            if ((bVar20 == 9) || (uVar16 = 0x18, bVar20 == 0x20)) {
              uVar16 = 0xf;
            }
          }
        }
        else {
LAB_0010786a:
          uVar16 = 0xf;
          if ((bVar20 != 9) && (bVar20 != 0x20)) {
            local_d8 = bc_strndup(src + local_e0,uVar22 - local_e0);
            uVar16 = 0x12;
          }
        }
        break;
      case 0x10:
        uVar16 = 0x18;
        if (bVar20 != bVar2) break;
        uVar16 = 0x11;
LAB_00107700:
        if (!bVar23) break;
        goto LAB_00107f3d;
      case 0x11:
        if (((bVar20 != bVar2) || (uVar16 = 0x11, bVar23)) &&
           ((bVar20 == 10 || ((bVar20 == 0xd || (uVar16 = 0x18, bVar23)))))) {
          bVar2 = 0;
          bc_string_append_printf(str,"<hr />%s",__ptr);
          goto LAB_00106fbd;
        }
        break;
      case 0x12:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0x12, bVar23)) {
          if ((((!bVar23) || (bVar20 == 0xd)) || (local_a0 = sVar5, bVar20 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar22;
          }
          pcVar12 = bc_strndup(src + local_b0,local_a0 - local_b0);
          sVar9 = strlen(local_d8);
          pcVar8 = bc_strdup_printf("%-*s",sVar9,"");
          _Var3 = bc_str_starts_with(pcVar12,local_d8);
          if (_Var3) {
            if (local_a8 == (bc_slist_t *)0x0) {
              local_a8 = (bc_slist_t *)0x0;
            }
            else {
              pbVar10 = bc_string_new();
              p_Var15 = local_a8;
              do {
                if (p_Var15->next == (_bc_slist_t *)0x0) {
                  bc_string_append_printf(pbVar10,"%s",p_Var15->data);
                }
                else {
                  bc_string_append_printf(pbVar10,"%s%s",p_Var15->data,__ptr);
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_bc_slist_t *)0x0);
              bc_slist_free_full(local_a8,free);
              pcVar6 = pbVar10->str;
              sVar9 = strlen(pcVar6);
              pcVar6 = blogc_content_parse_inline_internal(pcVar6,sVar9);
              bc_string_free(pbVar10,true);
              pcVar7 = bc_strdup(pcVar6);
              local_e8 = bc_slist_append(local_e8,pcVar7);
              free(pcVar6);
              local_a8 = (bc_slist_t *)0x0;
            }
          }
          else {
            _Var3 = bc_str_starts_with(pcVar12,pcVar8);
            if (!_Var3) {
              free(pcVar12);
              free(pcVar8);
              free(local_d8);
              bc_slist_free_full(local_e8,free);
              bc_slist_free_full(local_a8,free);
              uVar16 = 0x19;
              goto LAB_00107848;
            }
          }
          sVar9 = strlen(local_d8);
          pcVar6 = bc_strdup(pcVar12 + sVar9);
          local_a8 = bc_slist_append(local_a8,pcVar6);
          free(pcVar12);
          free(pcVar8);
          uVar16 = 0x13;
          if (bVar23) goto switchD_00106d05_caseD_13;
        }
        break;
      case 0x13:
switchD_00106d05_caseD_13:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0x12, uVar1 = uVar22, bVar23)) {
          if (local_a8 != (bc_slist_t *)0x0) {
            pbVar10 = bc_string_new();
            p_Var15 = local_a8;
            do {
              if (p_Var15->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar10,"%s",p_Var15->data);
              }
              else {
                bc_string_append_printf(pbVar10,"%s%s",p_Var15->data,__ptr);
              }
              p_Var15 = p_Var15->next;
            } while (p_Var15 != (_bc_slist_t *)0x0);
            bc_slist_free_full(local_a8,free);
            pcVar12 = pbVar10->str;
            sVar9 = strlen(pcVar12);
            pcVar12 = blogc_content_parse_inline_internal(pcVar12,sVar9);
            bc_string_free(pbVar10,true);
            pcVar8 = bc_strdup(pcVar12);
            local_e8 = bc_slist_append(local_e8,pcVar8);
            free(pcVar12);
          }
          bc_string_append_printf(str,"<ul>%s",__ptr);
          for (p_Var15 = local_e8; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var15->data,__ptr);
          }
          pcVar12 = "</ul>%s";
LAB_00107ede:
          local_a8 = (bc_slist_t *)0x0;
          bc_string_append_printf(str,pcVar12,__ptr);
          goto LAB_00107efe;
        }
        break;
      case 0x14:
        uVar16 = 0x14;
        if ((9 < (byte)(bVar20 - 0x30)) && (uVar16 = 0x15, bVar20 != 0x2e)) {
          uVar16 = 0x18;
          goto LAB_00107700;
        }
        break;
      case 0x15:
        uVar16 = 0x15;
        if (((bVar20 != 9) && (bVar20 != 0x20)) &&
           ((local_60 = uVar22 - local_e0, bVar20 == 10 ||
            ((bVar20 == 0xd || (uVar16 = 0x16, bVar23)))))) goto switchD_00106d05_caseD_16;
        break;
      case 0x16:
switchD_00106d05_caseD_16:
        if ((bVar20 == 10) || ((bVar20 == 0xd || (uVar16 = 0x16, bVar23)))) {
          if (((!bVar23) || ((bVar20 == 0xd || (local_a0 = sVar5, bVar20 == 10)))) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar22;
          }
          pcVar12 = bc_strndup(src + local_b0,local_a0 - local_b0);
          pcVar8 = bc_strdup_printf("%-*s",local_60,"");
          _Var3 = blogc_is_ordered_list_item(pcVar12,local_60);
          if (_Var3) {
            if (local_a8 != (bc_slist_t *)0x0) {
              pbVar10 = bc_string_new();
              p_Var15 = local_a8;
              do {
                if (p_Var15->next == (_bc_slist_t *)0x0) {
                  bc_string_append_printf(pbVar10,"%s",p_Var15->data);
                }
                else {
                  bc_string_append_printf(pbVar10,"%s%s",p_Var15->data,__ptr);
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_bc_slist_t *)0x0);
              bc_slist_free_full(local_a8,free);
              pcVar6 = pbVar10->str;
              sVar9 = strlen(pcVar6);
              pcVar6 = blogc_content_parse_inline_internal(pcVar6,sVar9);
              bc_string_free(pbVar10,true);
              pcVar7 = bc_strdup(pcVar6);
              local_e8 = bc_slist_append(local_e8,pcVar7);
              free(pcVar6);
            }
            local_a8 = (bc_slist_t *)0x0;
          }
          else {
            _Var3 = bc_str_starts_with(pcVar12,pcVar8);
            if (!_Var3) {
              free(pcVar12);
              free(pcVar8);
              bc_slist_free_full(local_e8,free);
              bc_slist_free_full(local_a8,free);
              uVar16 = 0x19;
              local_e8 = (bc_slist_t *)0x0;
              if (bVar23) goto LAB_00107f3d;
              break;
            }
          }
          pcVar6 = bc_strdup(pcVar12 + local_60);
          local_a8 = bc_slist_append(local_a8,pcVar6);
          free(pcVar12);
          free(pcVar8);
          uVar16 = 0x17;
          if (bVar23) goto LAB_00107945;
        }
        break;
      case 0x17:
LAB_00107945:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0x16, uVar1 = uVar22, bVar23)) {
          if (local_a8 != (bc_slist_t *)0x0) {
            pbVar10 = bc_string_new();
            p_Var15 = local_a8;
            do {
              if (p_Var15->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar10,"%s",p_Var15->data);
              }
              else {
                bc_string_append_printf(pbVar10,"%s%s",p_Var15->data,__ptr);
              }
              p_Var15 = p_Var15->next;
            } while (p_Var15 != (_bc_slist_t *)0x0);
            bc_slist_free_full(local_a8,free);
            pcVar12 = pbVar10->str;
            sVar9 = strlen(pcVar12);
            pcVar12 = blogc_content_parse_inline_internal(pcVar12,sVar9);
            bc_string_free(pbVar10,true);
            pcVar8 = bc_strdup(pcVar12);
            local_e8 = bc_slist_append(local_e8,pcVar8);
            free(pcVar12);
          }
          bc_string_append_printf(str,"<ol>%s",__ptr);
          for (p_Var15 = local_e8; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var15->data,__ptr);
          }
          pcVar12 = "</ol>%s";
          goto LAB_00107ede;
        }
        break;
      case 0x18:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0x18, bVar23)) {
          if (bVar23) {
            if (((bVar20 == 0xd) || (local_a0 = sVar5, bVar20 == 10)) &&
               (local_a0 = local_88, local_88 == 0)) {
              local_a0 = uVar22;
            }
            goto LAB_0010775b;
          }
          local_a0 = local_88;
          if (local_88 == 0) {
            local_a0 = uVar22;
          }
          uVar16 = 0x19;
        }
        break;
      case 0x19:
LAB_0010775b:
        if (((bVar20 == 10) || (bVar20 == 0xd)) || (uVar16 = 0x18, bVar23)) {
          pcVar12 = bc_strndup(src + local_e0,local_a0 - local_e0);
          if ((description != (char **)0x0) && (*description == (char *)0x0)) {
            pcVar8 = blogc_fix_description(pcVar12);
            *description = pcVar8;
          }
          sVar9 = strlen(pcVar12);
          pcVar8 = blogc_content_parse_inline_internal(pcVar12,sVar9);
          bc_string_append_printf(str,"<p>%s</p>%s",pcVar8,__ptr);
          free(pcVar8);
          free(pcVar12);
          goto LAB_00107b7a;
        }
      }
      local_b0 = uVar1;
      uVar22 = uVar22 + 1;
LAB_00107f3d:
    } while (uVar22 < sVar5);
  }
  if (endl == (char **)0x0) {
    free(__ptr);
  }
  pcVar12 = bc_string_free(str,false);
  return pcVar12;
}

Assistant:

char*
blogc_content_parse(const char *src, size_t *end_excerpt, char **first_header,
    char **description, char **endl, bc_slist_t **headers)
{
    // src is always nul-terminated.
    size_t src_len = strlen(src);

    size_t current = 0;
    size_t start = 0;
    size_t start2 = 0;
    size_t end = 0;
    size_t eend = 0;
    size_t real_end = 0;

    size_t header_level = 0;
    char *prefix = NULL;
    size_t prefix_len = 0;
    char *tmp = NULL;
    char *tmp2 = NULL;
    char *parsed = NULL;
    char *slug = NULL;

    char *line_ending = NULL;
    bool line_ending_found = false;
    if (endl != NULL) {
        if (*endl != NULL) {
            line_ending_found = true;
        }
        else {
            *endl = bc_malloc(3 * sizeof(char));
        }
        line_ending = *endl;
    }
    else {
        line_ending = bc_malloc(3 * sizeof(char));
    }

    // this isn't empty because we need some reasonable default value in the
    // unlikely case that we need to print some line ending before evaluating
    // the "real" value.
    if (!line_ending_found) {
        line_ending[0] = '\n';
        line_ending[1] = '\0';
    }

    char d = '\0';

    bc_slist_t *lines = NULL;
    bc_slist_t *lines2 = NULL;

    bc_string_t *rv = bc_string_new();
    bc_string_t *tmp_str = NULL;

    blogc_content_parser_state_t state = CONTENT_START_LINE;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        if (c == '\n' || c == '\r') {
            if ((current + 1) < src_len) {
                if ((c == '\n' && src[current + 1] == '\r') ||
                    (c == '\r' && src[current + 1] == '\n'))
                {
                    if (!line_ending_found) {
                        line_ending[0] = c;
                        line_ending[1] = src[current + 1];
                        line_ending[2] = '\0';
                        line_ending_found = true;
                    }
                    real_end = current;
                    c = src[++current];
                    is_last = current == src_len - 1;
                }
            }
            if (!line_ending_found) {
                line_ending[0] = c;
                line_ending[1] = '\0';
                line_ending_found = true;
            }
        }

        switch (state) {

            case CONTENT_START_LINE:
                if (c == '\n' || c == '\r' || is_last)
                    break;
                start = current;
                if (c == '.') {
                    if (end_excerpt != NULL) {
                        eend = rv->len;  // fuck it
                        state = CONTENT_EXCERPT;
                        break;
                    }
                }
                if (c == '#') {
                    header_level = 1;
                    state = CONTENT_HEADER;
                    break;
                }
                if (c == '*' || c == '+' || c == '-') {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS;
                    d = c;
                    break;
                }
                if (c >= '0' && c <= '9') {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    start2 = current;
                    state = CONTENT_CODE;
                    break;
                }
                if (c == '<') {
                    state = CONTENT_HTML;
                    break;
                }
                if (c == '>') {
                    state = CONTENT_BLOCKQUOTE;
                    start2 = current;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT:
                if (end_excerpt != NULL) {
                    if (c == '.')
                        break;
                    if (c == '\n' || c == '\r') {
                        state = CONTENT_EXCERPT_END;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT_END:
                if (end_excerpt != NULL) {
                    if (c == '\n' || c == '\r') {
                        *end_excerpt = eend;
                        state = CONTENT_START_LINE;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH_END;
                break;

            case CONTENT_HEADER:
                if (c == '#') {
                    header_level += 1;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    state = CONTENT_HEADER_TITLE_START;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HEADER_TITLE_START:
                if (c == ' ' || c == '\t')
                    break;
                start = current;
                if (c != '\n' && c != '\r') {
                    state = CONTENT_HEADER_TITLE;
                    break;
                }

            case CONTENT_HEADER_TITLE:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start, end - start);
                    if (first_header != NULL && *first_header == NULL)
                        *first_header = blogc_htmlentities(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    slug = blogc_slugify(tmp);
                    if (headers != NULL)
                        *headers = blogc_toctree_append(*headers, header_level, slug, parsed);
                    if (slug == NULL)
                        bc_string_append_printf(rv, "<h%d>%s</h%d>%s",
                            header_level, parsed, header_level, line_ending);
                    else
                        bc_string_append_printf(rv, "<h%d id=\"%s\">%s</h%d>%s",
                            header_level, slug, parsed, header_level,
                            line_ending);
                    free(slug);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                break;

            case CONTENT_HTML:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_HTML_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_HTML_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    bc_string_append_printf(rv, "%s%s", tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_HTML;
                break;

            case CONTENT_BLOCKQUOTE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_BLOCKQUOTE_START;
                break;

            case CONTENT_BLOCKQUOTE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_BLOCKQUOTE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        if (is_last) {
                            free(tmp);
                            tmp = NULL;
                            continue;
                        }
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_BLOCKQUOTE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp_str = bc_string_new();
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(tmp_str, "%s%s", l->data,
                            line_ending);
                    // do not propagate title and description to blockquote parsing,
                    // because we just want paragraphs from first level of
                    // content.
                    tmp = blogc_content_parse(tmp_str->str, NULL, NULL, NULL, endl, NULL);
                    bc_string_append_printf(rv, "<blockquote>%s</blockquote>%s",
                        tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    bc_string_free(tmp_str, true);
                    tmp_str = NULL;
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_BLOCKQUOTE_START;
                }
                break;

            case CONTENT_CODE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_CODE_START;
                break;

            case CONTENT_CODE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_CODE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        free(tmp);
                        tmp = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_CODE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append(rv, "<pre><code>");
                    for (bc_slist_t *l = lines; l != NULL; l = l->next) {
                        char *tmp_line = blogc_htmlentities(l->data);
                        if (l->next == NULL)
                            bc_string_append_printf(rv, "%s", tmp_line);
                        else
                            bc_string_append_printf(rv, "%s%s", tmp_line,
                                line_ending);
                        free(tmp_line);
                    }
                    bc_string_append_printf(rv, "</code></pre>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_CODE_START;
                }
                break;

            case CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS:
                if (current == start+1) {
                    if (c == d) { // horizontal rule or '**' emphasis
                        state = CONTENT_HORIZONTAL_RULE_OR_EMPHASIS;
                        break;
                    }
                    else if (c != ' ' && c != '\t' && d == '*') { // is '*' emphasis
                        state = CONTENT_PARAGRAPH;
                        break;
                    }
                }
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_UNORDERED_LIST_START;
                break;

            case CONTENT_HORIZONTAL_RULE_OR_EMPHASIS:
                // 3rd '-' or '*' required for a horizontal rule
                if (c == d) {
                    state = CONTENT_HORIZONTAL_RULE;
                    if (is_last)
                        continue;
                    break;
                }
                // is '**' emphasis
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HORIZONTAL_RULE:
                if (c == d && !is_last) {
                    break;
                }
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append_printf(rv, "<hr />%s", line_ending);
                    state = CONTENT_START_LINE;
                    start = current;
                    d = '\0';
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_UNORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", strlen(prefix), "");
                    if (bc_str_starts_with(tmp, prefix)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_UNORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_UNORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ul>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ul>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_START;
                }
                break;

            case CONTENT_ORDERED_LIST:
                if (c >= '0' && c <= '9')
                    break;
                if (c == '.') {
                    state = CONTENT_ORDERED_LIST_SPACE;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                if (is_last)
                    continue;
                break;

            case CONTENT_ORDERED_LIST_SPACE:
                if (c == ' ' || c == '\t')
                    break;
                prefix_len = current - start;
                state = CONTENT_ORDERED_LIST_START;
                if (c != '\n' && c != '\r' && !is_last)
                    break;

            case CONTENT_ORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", prefix_len, "");
                    if (blogc_is_ordered_list_item(tmp, prefix_len)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(parsed);
                        parsed = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_ORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_ORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ol>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ol>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST_START;
                }
                break;

            case CONTENT_PARAGRAPH:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_PARAGRAPH_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_PARAGRAPH_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    if (description != NULL && *description == NULL)
                        *description = blogc_fix_description(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    bc_string_append_printf(rv, "<p>%s</p>%s", parsed,
                        line_ending);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_PARAGRAPH;
                break;

        }

        current++;
    }

    if (endl == NULL) {
        free(line_ending);
    }

    return bc_string_free(rv, false);
}